

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_device.c
# Opt level: O0

int device_main(int argc,char **argv)

{
  int iVar1;
  int local_44;
  int local_40;
  int i;
  int ip_mode;
  unsigned_short port;
  char *web_dir_path;
  char *desc_doc_name;
  char *iface;
  char **ppcStack_18;
  uint portTemp;
  char **argv_local;
  int argc_local;
  
  iface._4_4_ = 0;
  desc_doc_name = (char *)0x0;
  web_dir_path = (char *)0x0;
  _ip_mode = (char *)0x0;
  i._2_2_ = 0;
  local_40 = 1;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  SampleUtil_Initialize(linux_print);
  local_44 = 1;
  do {
    if ((int)argv_local <= local_44) {
      i._2_2_ = (unsigned_short)iface._4_4_;
      iVar1 = TvDeviceStart(desc_doc_name,i._2_2_,web_dir_path,_ip_mode,local_40,linux_print,0);
      return iVar1;
    }
    iVar1 = strcmp(ppcStack_18[local_44],"-i");
    if (iVar1 == 0) {
      local_44 = local_44 + 1;
      desc_doc_name = ppcStack_18[local_44];
    }
    else {
      iVar1 = strcmp(ppcStack_18[local_44],"-port");
      if (iVar1 == 0) {
        local_44 = local_44 + 1;
        __isoc99_sscanf(ppcStack_18[local_44],"%u",(long)&iface + 4);
      }
      else {
        iVar1 = strcmp(ppcStack_18[local_44],"-desc");
        if (iVar1 == 0) {
          local_44 = local_44 + 1;
          web_dir_path = ppcStack_18[local_44];
        }
        else {
          iVar1 = strcmp(ppcStack_18[local_44],"-webdir");
          if (iVar1 == 0) {
            local_44 = local_44 + 1;
            _ip_mode = ppcStack_18[local_44];
          }
          else {
            iVar1 = strcmp(ppcStack_18[local_44],"-m");
            if (iVar1 == 0) {
              local_44 = local_44 + 1;
              __isoc99_sscanf(ppcStack_18[local_44],"%d",&local_40);
            }
            else {
              iVar1 = strcmp(ppcStack_18[local_44],"-help");
              if (iVar1 == 0) {
                SampleUtil_Print("Usage: %s -i interface -port port -desc desc_doc_name -webdir web_dir_path -m ip_mode -help (this message)\n"
                                 ,*ppcStack_18);
                SampleUtil_Print(
                                "\tinterface:     interface address of the device (must match desc. doc)\n\t\te.g.: eth0\n\tport:          Port number to use for receiving UPnP messages (must match desc. doc)\n\t\te.g.: 5431\n\tdesc_doc_name: name of device description document\n\t\te.g.: tvdevicedesc.xml\n\tweb_dir_path:  Filesystem path where web files related to the device are stored\n\t\te.g.: /upnp/sample/tvdevice/web\n\tip_mode:       set to 1 for IPv4 (default), 2 for IPv6 LLA and 3 for IPv6 ULA or GUA\n"
                                );
                return 1;
              }
            }
          }
        }
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

int device_main(int argc, char *argv[])
{
	unsigned int portTemp = 0;
	char *iface = NULL;
	char *desc_doc_name = NULL;
	char *web_dir_path = NULL;
	unsigned short port = 0;
	int ip_mode = IP_MODE_IPV4;
	int i = 0;

	SampleUtil_Initialize(linux_print);
	/* Parse options */
	for (i = 1; i < argc; i++) {
		if (strcmp(argv[i], "-i") == 0) {
			iface = argv[++i];
		} else if (strcmp(argv[i], "-port") == 0) {
#ifdef WIN32
			sscanf_s(argv[++i], "%u", &portTemp);
#else
			sscanf(argv[++i], "%u", &portTemp);
#endif
		} else if (strcmp(argv[i], "-desc") == 0) {
			desc_doc_name = argv[++i];
		} else if (strcmp(argv[i], "-webdir") == 0) {
			web_dir_path = argv[++i];
		} else if (strcmp(argv[i], "-m") == 0) {
#ifdef _WIN32
			sscanf_s(argv[++i], "%d", &ip_mode);
#else
			sscanf(argv[++i], "%d", &ip_mode);
#endif
		} else if (strcmp(argv[i], "-help") == 0) {
			SampleUtil_Print(
				"Usage: %s -i interface -port port"
				" -desc desc_doc_name -webdir web_dir_path"
				" -m ip_mode -help (this message)\n",
				argv[0]);
			SampleUtil_Print(
				"\tinterface:     interface address of the "
				"device"
				" (must match desc. doc)\n"
				"\t\te.g.: eth0\n"
				"\tport:          Port number to use for"
				" receiving UPnP messages (must match desc. "
				"doc)\n"
				"\t\te.g.: 5431\n"
				"\tdesc_doc_name: name of device description "
				"document\n"
				"\t\te.g.: tvdevicedesc.xml\n"
				"\tweb_dir_path:  Filesystem path where web "
				"files"
				" related to the device are stored\n"
				"\t\te.g.: /upnp/sample/tvdevice/web\n"
				"\tip_mode:       set to 1 for IPv4 (default), "
				"2 for IPv6 LLA and 3 for IPv6 ULA or GUA\n");
			return 1;
		}
	}
	port = (unsigned short)portTemp;
	return TvDeviceStart(iface,
		port,
		desc_doc_name,
		web_dir_path,
		ip_mode,
		linux_print,
		0);
}